

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLOutput.cpp
# Opt level: O2

void __thiscall
Test::HTMLOutput::generate(HTMLOutput *this,ostream *stream,bool includePassed,string *title)

{
  ostream *poVar1;
  SuiteInfo *suite;
  
  generateHeader(this,stream,title);
  std::operator<<(stream,"<body>");
  generateSuitesTable(this,stream,includePassed);
  poVar1 = std::operator<<(stream,"<br>");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (suite = *(SuiteInfo **)(this + 8); suite != *(SuiteInfo **)(this + 0x10); suite = suite + 1)
  {
    if ((includePassed) || (suite->numTests != suite->numPositiveTests)) {
      generateTestsTable(this,stream,suite,false);
      poVar1 = std::operator<<(stream,"<br>");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
  }
  poVar1 = std::operator<<(stream,"</body></html>");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void HTMLOutput::generate(std::ostream &stream, bool includePassed, const std::string &title) {
  // 1. print header (including style-information)
  generateHeader(stream, title);
  stream << "<body>";
  // 2. print table
  generateSuitesTable(stream, includePassed);
  stream << "<br>" << std::endl;
  auto suiteInfo = suites.begin();
  while (suiteInfo != suites.end()) {
    if (includePassed || suiteInfo->numTests != suiteInfo->numPositiveTests) {
      generateTestsTable(stream, *suiteInfo, includePassed);
      stream << "<br>" << std::endl;
    }
    ++suiteInfo;
  }
  stream << "</body></html>" << std::endl;
  // flush all data to the stream
  stream.flush();
}